

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.hh
# Opt level: O1

void phosg::strip_multiline_comments<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
               bool allow_unterminated)

{
  char cVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  runtime_error *this;
  ulong uVar5;
  size_type __n;
  bool bVar6;
  
  uVar5 = s->_M_string_length;
  if (uVar5 == 0) {
    bVar6 = true;
    __n = 0;
  }
  else {
    bVar6 = false;
    __n = 0;
    uVar3 = 0;
    do {
      pcVar2 = (s->_M_dataplus)._M_p;
      cVar1 = pcVar2[uVar3];
      if (bVar6) {
        if (((cVar1 == '*') && (uVar3 + 1 < uVar5)) && (pcVar2[uVar3 + 1] == '/')) {
          uVar4 = uVar3 + 2;
          bVar6 = false;
        }
        else {
          uVar4 = uVar3 + 1;
          if (cVar1 == '\n') {
            pcVar2[__n] = '\n';
            goto LAB_00114654;
          }
        }
      }
      else if (((cVar1 == '/') && (uVar3 + 1 < uVar5)) && (pcVar2[uVar3 + 1] == '*')) {
        uVar4 = uVar3 + 2;
        bVar6 = true;
      }
      else {
        pcVar2[__n] = cVar1;
LAB_00114654:
        uVar4 = uVar3 + 1;
        __n = __n + 1;
      }
      uVar5 = s->_M_string_length;
      uVar3 = uVar4;
    } while (uVar4 < uVar5);
    bVar6 = (bool)(bVar6 ^ 1);
  }
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (s,__n,'\0');
  if (allow_unterminated || bVar6) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this,"unterminated multiline comment");
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void strip_multiline_comments(StrT& s, bool allow_unterminated = false) {
  bool is_in_comment = false;
  size_t write_offset = 0;
  for (size_t z = 0; z < s.size();) {
    if (!is_in_comment) {
      if ((s[z] == '/') && (z + 1 < s.size()) && (s[z + 1] == '*')) {
        is_in_comment = true;
        z += 2;
      } else {
        s[write_offset++] = s[z++];
      }
    } else {
      if ((s[z] == '*') && (z + 1 < s.size()) && (s[z + 1] == '/')) {
        is_in_comment = false;
        z += 2;
      } else {
        if (s[z++] == '\n') {
          s[write_offset++] = '\n';
        }
      }
    }
  }
  s.resize(write_offset);

  if (!allow_unterminated && is_in_comment) {
    throw std::runtime_error("unterminated multiline comment");
  }
}